

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void QGraphicsWidget::setTabOrder(QWindow *first,QWindow *second)

{
  QGraphicsWidget *pQVar1;
  QGraphicsWidget *pQVar2;
  QGraphicsScene *pQVar3;
  QGraphicsScene *pQVar4;
  QGraphicsScenePrivate *pQVar5;
  QGraphicsWidgetPrivate *pQVar6;
  QGraphicsWidget *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QWindow *secondFocusNext;
  QWindow *secondFocusPrev;
  QWindow *firstFocusNext;
  QGraphicsScenePrivate *sceneD;
  QGraphicsScene *scene;
  char *in_stack_ffffffffffffff18;
  QGraphicsWidget *pQVar7;
  undefined8 in_stack_ffffffffffffff20;
  int line;
  char *in_stack_ffffffffffffff28;
  QGraphicsWidget *pQVar8;
  QMessageLogger *in_stack_ffffffffffffff30;
  QGraphicsScene *local_b8;
  char local_68 [32];
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI == (QGraphicsWidget *)0x0) && (in_RSI == (QGraphicsWidget *)0x0)) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,line,in_stack_ffffffffffffff18);
    QMessageLogger::warning(local_28,"QGraphicsWidget::setTabOrder(0, 0) is undefined");
  }
  else {
    if ((in_RDI != (QGraphicsWidget *)0x0) && (in_RSI != (QGraphicsWidget *)0x0)) {
      pQVar3 = QGraphicsItem::scene((QGraphicsItem *)0xa4f30d);
      pQVar4 = QGraphicsItem::scene((QGraphicsItem *)0xa4f320);
      if (pQVar3 != pQVar4) {
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,line,
                   in_stack_ffffffffffffff18);
        pQVar3 = QGraphicsItem::scene((QGraphicsItem *)0xa4f351);
        pQVar4 = QGraphicsItem::scene((QGraphicsItem *)0xa4f364);
        QMessageLogger::warning
                  (local_48,"QGraphicsWidget::setTabOrder: scenes %p and %p are different",pQVar3,
                   pQVar4);
        goto LAB_00a4f562;
      }
    }
    if (in_RDI == (QGraphicsWidget *)0x0) {
      local_b8 = QGraphicsItem::scene((QGraphicsItem *)0xa4f3b2);
    }
    else {
      local_b8 = QGraphicsItem::scene((QGraphicsItem *)0xa4f39d);
    }
    if (local_b8 == (QGraphicsScene *)0x0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,line,in_stack_ffffffffffffff18)
      ;
      QMessageLogger::warning
                (local_68,
                 "QGraphicsWidget::setTabOrder: assigning tab order from/to the scene requires the item to be in a scene."
                );
    }
    else {
      pQVar5 = QGraphicsScene::d_func((QGraphicsScene *)0xa4f404);
      if (in_RDI == (QGraphicsWidget *)0x0) {
        pQVar5->tabFocusFirst = in_RSI;
      }
      else if (in_RSI == (QGraphicsWidget *)0x0) {
        pQVar6 = d_func((QGraphicsWidget *)0xa4f439);
        pQVar5->tabFocusFirst = pQVar6->focusNext;
      }
      else {
        pQVar6 = d_func((QGraphicsWidget *)0xa4f45b);
        pQVar8 = pQVar6->focusNext;
        if (pQVar8 != in_RSI) {
          pQVar6 = d_func((QGraphicsWidget *)0xa4f482);
          pQVar1 = pQVar6->focusPrev;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f498);
          pQVar2 = pQVar6->focusNext;
          pQVar7 = in_RSI;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f4b7);
          pQVar6->focusPrev = pQVar7;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f4d6);
          pQVar6->focusNext = in_RSI;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f4f6);
          pQVar6->focusNext = pQVar8;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f516);
          pQVar6->focusPrev = in_RDI;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f536);
          pQVar6->focusNext = pQVar2;
          pQVar6 = d_func((QGraphicsWidget *)0xa4f556);
          pQVar6->focusPrev = pQVar1;
        }
      }
    }
  }
LAB_00a4f562:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidget::setTabOrder(QGraphicsWidget *first, QGraphicsWidget *second)
{
    if (!first && !second) {
        qWarning("QGraphicsWidget::setTabOrder(0, 0) is undefined");
        return;
    }
    if ((first && second) && first->scene() != second->scene()) {
        qWarning("QGraphicsWidget::setTabOrder: scenes %p and %p are different",
                 first->scene(), second->scene());
        return;
    }
    QGraphicsScene *scene = first ? first->scene() : second->scene();
    if (!scene) {
        qWarning("QGraphicsWidget::setTabOrder: assigning tab order from/to the"
                 " scene requires the item to be in a scene.");
        return;
    }

    // If either first or second are 0, the scene's tabFocusFirst is updated
    // to point to the first item in the scene's focus chain. Then first or
    // second are set to point to tabFocusFirst.
    QGraphicsScenePrivate *sceneD = scene->d_func();
    if (!first) {
        sceneD->tabFocusFirst = second;
        return;
    }
    if (!second) {
        sceneD->tabFocusFirst = first->d_func()->focusNext;
        return;
    }

    // Both first and second are != 0.
    QGraphicsWidget *firstFocusNext = first->d_func()->focusNext;
    if (firstFocusNext == second) {
        // Nothing to do.
        return;
    }

    // Update the focus chain.
    QGraphicsWidget *secondFocusPrev = second->d_func()->focusPrev;
    QGraphicsWidget *secondFocusNext = second->d_func()->focusNext;
    firstFocusNext->d_func()->focusPrev = second;
    first->d_func()->focusNext = second;
    second->d_func()->focusNext = firstFocusNext;
    second->d_func()->focusPrev = first;
    secondFocusPrev->d_func()->focusNext = secondFocusNext;
    secondFocusNext->d_func()->focusPrev = secondFocusPrev;

    Q_ASSERT(first->d_func()->focusNext->d_func()->focusPrev == first);
    Q_ASSERT(first->d_func()->focusPrev->d_func()->focusNext == first);

    Q_ASSERT(second->d_func()->focusNext->d_func()->focusPrev == second);
    Q_ASSERT(second->d_func()->focusPrev->d_func()->focusNext == second);

}